

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O2

void Fraig_ManProveMiter(Fraig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  Fraig_Node_t *pFVar5;
  
  if (p->fTryProve != 0) {
    Abc_Clock();
    for (lVar4 = 0; lVar4 < p->vOutputs->nSize; lVar4 = lVar4 + 1) {
      pFVar5 = (Fraig_Node_t *)((ulong)p->vOutputs->pArray[lVar4] & 0xfffffffffffffffe);
      if (((p->pConst1 != pFVar5) &&
          (iVar2 = Fraig_CompareSimInfo(pFVar5,p->pConst1,p->nWordsRand,1), iVar2 != 0)) &&
         (iVar2 = Fraig_NodeIsEquivalent(p,p->pConst1,pFVar5,-1,p->nSeconds), iVar2 != 0)) {
        uVar1 = *(uint *)(p->vOutputs->pArray + lVar4);
        uVar3 = Fraig_NodeComparePhase(p->pConst1,pFVar5);
        pFVar5 = (Fraig_Node_t *)((ulong)p->pConst1 ^ 1);
        if ((uVar1 & 1) == uVar3) {
          pFVar5 = p->pConst1;
        }
        p->vOutputs->pArray[lVar4] = pFVar5;
      }
    }
  }
  return;
}

Assistant:

void Fraig_ManProveMiter( Fraig_Man_t * p )
{
    Fraig_Node_t * pNode;
    int i;
    abctime clk;

    if ( !p->fTryProve )
        return;
 
    clk = Abc_Clock();
    // consider all outputs of the multi-output miter
    for ( i = 0; i < p->vOutputs->nSize; i++ )
    {
        pNode = Fraig_Regular(p->vOutputs->pArray[i]);
        // skip already constant nodes
        if ( pNode == p->pConst1 )
            continue;
        // skip nodes that are different according to simulation
        if ( !Fraig_CompareSimInfo( pNode, p->pConst1, p->nWordsRand, 1 ) )
            continue;
        if ( Fraig_NodeIsEquivalent( p, p->pConst1, pNode, -1, p->nSeconds ) )
        {
            if ( Fraig_IsComplement(p->vOutputs->pArray[i]) ^ Fraig_NodeComparePhase(p->pConst1, pNode) )
                p->vOutputs->pArray[i] = Fraig_Not(p->pConst1);
            else
                p->vOutputs->pArray[i] = p->pConst1;
        }
    }
    if ( p->fVerboseP ) 
    {
//        ABC_PRT( "Final miter proof time", Abc_Clock() - clk );
    }
}